

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

void feat_s3_cep(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x220,"void feat_s3_cep(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream == 1) {
    if (fcb->window_size == 0) {
      memcpy(*feat,*mfc,(long)fcb->cepsize << 2);
      return;
    }
    __assert_fail("feat_window_size(fcb) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x222,"void feat_s3_cep(feat_t *, mfcc_t **, mfcc_t **)");
  }
  __assert_fail("feat_n_stream(fcb) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x221,"void feat_s3_cep(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_s3_cep(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    assert(fcb);
    assert(feat_n_stream(fcb) == 1);
    assert(feat_window_size(fcb) == 0);

    /* CEP */
    memcpy(feat[0], mfc[0], feat_cepsize(fcb) * sizeof(mfcc_t));
}